

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# san.c
# Opt level: O3

void san_unguard_pages_impl
               (tsdn_t *tsdn,ehooks_t *ehooks,edata_t *edata,emap_t *emap,_Bool left,_Bool right,
               _Bool remap)

{
  byte *pbVar1;
  ulong uVar2;
  void *pvVar3;
  void *guard1;
  void *pvVar4;
  long lVar5;
  
  if (remap) {
    duckdb_je_emap_deregister_boundary(tsdn,emap,edata);
  }
  uVar2 = (edata->field_2).e_size_esn & 0xfffffffffffff000;
  lVar5 = (ulong)right * 0x1000 + 0x1000;
  pvVar3 = (void *)((ulong)edata->e_addr & 0xfffffffffffff000);
  pvVar4 = (void *)((long)pvVar3 + -0x1000);
  if (!left) {
    lVar5 = 0x1000;
    pvVar4 = pvVar3;
  }
  if ((extent_hooks_t *)(ehooks->ptr).repr == &duckdb_je_ehooks_default_extent_hooks) {
    guard1 = (void *)((long)pvVar3 + -0x1000);
    if (!left) {
      guard1 = (void *)0x0;
    }
    pvVar3 = (void *)((long)pvVar3 + uVar2);
    if (!right) {
      pvVar3 = (void *)0x0;
    }
    duckdb_je_ehooks_default_unguard_impl(guard1,pvVar3);
  }
  (edata->field_2).e_size_esn = (ulong)((uint)(edata->field_2).e_size_esn & 0xfff) | lVar5 + uVar2;
  edata->e_addr = pvVar4;
  pbVar1 = (byte *)((long)&edata->e_bits + 2);
  *pbVar1 = *pbVar1 & 0xfe;
  if (remap) {
    duckdb_je_emap_register_boundary(tsdn,emap,edata,0xe8,false);
    return;
  }
  return;
}

Assistant:

static void
san_unguard_pages_impl(tsdn_t *tsdn, ehooks_t *ehooks, edata_t *edata,
    emap_t *emap, bool left, bool right, bool remap) {
	assert(left || right);
	/* Remove the inner boundary which no longer exists. */
	if (remap) {
		assert(edata_state_get(edata) == extent_state_active);
		emap_deregister_boundary(tsdn, emap, edata);
	} else {
		assert(edata_state_get(edata) == extent_state_retained);
	}

	size_t size = edata_size_get(edata);
	size_t size_with_guards = (left && right)
	    ? san_two_side_guarded_sz(size)
	    : san_one_side_guarded_sz(size);

	void *guard1, *guard2, *addr;
	san_find_unguarded_addr(edata, &guard1, &guard2, &addr, size, left,
	    right);

	ehooks_unguard(tsdn, ehooks, (void *)guard1, (void *)guard2);

	/* Update the true addr and usable size of the edata. */
	edata_size_set(edata, size_with_guards);
	edata_addr_set(edata, (void *)addr);
	edata_guarded_set(edata, false);

	/*
	 * Then re-register the outer boundary including the guards, if
	 * requested.
	 */
	if (remap) {
		emap_register_boundary(tsdn, emap, edata, SC_NSIZES,
		    /* slab */ false);
	}
}